

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode o3dgc::SaveIntData(Vector<long> *data,BinaryStream *bstream)

{
  unsigned_long position;
  unsigned_long value;
  unsigned_long i;
  unsigned_long uVar1;
  
  position = (bstream->m_stream).m_size;
  BinaryStream::WriteUInt32ASCII(bstream,0);
  value = data->m_size;
  BinaryStream::WriteUInt32ASCII(bstream,value);
  for (uVar1 = 0; value != uVar1; uVar1 = uVar1 + 1) {
    BinaryStream::WriteIntASCII(bstream,data->m_buffer[uVar1]);
  }
  BinaryStream::WriteUInt32ASCII(bstream,position,(bstream->m_stream).m_size - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveIntData(const Vector<long> & data,
                                  BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size       = data.GetSize();
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; ++i)
        {
            bstream.WriteIntASCII(data[i]);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }